

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O3

void __thiscall pg::PPSolver::reportRegion(PPSolver *this,int p)

{
  Game *pGVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  _label_vertex local_50;
  int *local_40;
  int *local_38;
  
  poVar4 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[1;33mregion \x1b[36m",0x13);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[m",3);
  piVar11 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar9 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar11 != piVar9) {
    local_40 = piVar9;
    do {
      iVar5 = *piVar11;
      uVar10 = (ulong)iVar5;
      if (this->region[uVar10] == p) {
        poVar4 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," \x1b[37m",6);
        local_50.g = (this->super_Solver).game;
        local_50.v = iVar5;
        poVar4 = operator<<(poVar4,&local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[m",3);
      }
      pGVar1 = (this->super_Solver).game;
      if ((((pGVar1->_owner)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) == (bool)((byte)p & 1)
         ) {
        iVar5 = pGVar1->_outedges[pGVar1->_firstouts[uVar10]];
        if (iVar5 != -1) {
          piVar9 = pGVar1->_outedges + (long)pGVar1->_firstouts[uVar10] + 1;
          bVar3 = false;
          local_38 = piVar11;
          do {
            uVar6 = (ulong)iVar5;
            if (((((this->super_Solver).disabled)->_bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) &&
               (this->region[uVar6] != p && this->region[uVar6] != -2)) {
              pcVar8 = "(";
              if (bVar3) {
                pcVar8 = ",";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_Solver).logger,pcVar8,1);
              if (this->region[uVar6] < p) {
                poVar4 = (this->super_Solver).logger;
                if (((this->super_Solver).game)->_priority[uVar10] == p) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[36m",5);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->region[uVar6]);
                  lVar7 = 3;
                  pcVar8 = "\x1b[m";
                }
                else {
                  lVar7 = 0xd;
                  pcVar8 = "\x1b[31;1mesc\x1b[m";
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
                bVar3 = true;
              }
              else {
                poVar4 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[36m",5);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->region[uVar6]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[m",3);
                bVar3 = true;
              }
            }
            iVar5 = *piVar9;
            piVar9 = piVar9 + 1;
          } while (iVar5 != -1);
          piVar9 = local_40;
          piVar11 = local_38;
          if (bVar3) {
            poVar4 = (this->super_Solver).logger;
            lVar7 = 1;
            pcVar8 = ")";
            goto LAB_0015b0d0;
          }
        }
      }
      else {
        uVar6 = (ulong)this->strategy[uVar10];
        if (uVar6 == 0xffffffffffffffff) {
          if (pGVar1->_priority[uVar10] != p) {
            poVar4 = (this->super_Solver).logger;
            lVar7 = 0xc;
            pcVar8 = "\x1b[31;1m--\x1b[m";
            goto LAB_0015b0d0;
          }
        }
        else if (((((this->super_Solver).disabled)->_bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0)
                && (this->region[uVar6] == p)) {
          poVar4 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
          local_50.g = (this->super_Solver).game;
          local_50.v = this->strategy[uVar10];
          operator<<(poVar4,&local_50);
        }
        else {
          poVar4 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->\x1b[31;1m",9);
          local_50.g = (this->super_Solver).game;
          local_50.v = this->strategy[uVar10];
          poVar4 = operator<<(poVar4,&local_50);
          lVar7 = 3;
          pcVar8 = "\x1b[m";
LAB_0015b0d0:
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
        }
      }
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar9);
  }
  poVar4 = (this->super_Solver).logger;
  cVar2 = (char)poVar4;
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void
PPSolver::reportRegion(int p)
{
    const int pl = p&1;
    logger << "\033[1;33mregion \033[36m" << p << "\033[m";
    for (int n : regions[p]) {
        if (region[n] == p) logger << " \033[37m" << label_vertex(n) << "\033[m";
        if (owner(n) == pl) {
            if (strategy[n] == -1) {
                if (priority(n) != p) logger << "\033[31;1m--\033[m";
            } else {
                if (disabled[strategy[n]] or region[strategy[n]] != p) logger << "->\033[31;1m" << label_vertex(strategy[n]) << "\033[m";
                else logger << "->" << label_vertex(strategy[n]);
            }
        } else {
            bool got = false;
            for (auto curedge = outs(n); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                if (region[to] == -2) continue;
                if (region[to] == p) continue;
                if (!got) logger << "(";
                else logger << ",";
                got = true;
                if (region[to] < p) {
                    if (priority(n) != p) logger << "\033[31;1mesc\033[m";
                    else logger << "\033[36m" << region[to] << "\033[m";
                } else logger << "\033[36m" << region[to] << "\033[m";
            }
            if (got) logger << ")";
        }
    }
    logger << std::endl;
}